

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

bool google::AppendFlagsIntoFile(string *filename,char *prog_name)

{
  pointer __stream;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  google local_98 [32];
  CommandLineFlagInfo *local_78;
  const_iterator local_70;
  __normal_iterator<google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
  local_68;
  CommandLineFlagInfo *local_60;
  __normal_iterator<google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
  local_58;
  iterator i;
  undefined1 local_40 [8];
  vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> flags;
  FILE *fp;
  char *prog_name_local;
  string *filename_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = SafeFOpen((FILE **)&flags.
                              super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar3,"a");
  if (iVar2 == 0) {
    if (prog_name != (char *)0x0) {
      fprintf((FILE *)flags.
                      super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"%s\n",prog_name);
    }
    std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::vector
              ((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> *)
               local_40);
    GetAllFlags((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> *
                )local_40);
    __gnu_cxx::
    __normal_iterator<google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
    ::__normal_iterator(&local_58);
    local_60 = (CommandLineFlagInfo *)
               std::
               vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::
               begin((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                      *)local_40);
    local_58._M_current = local_60;
    while( true ) {
      local_68._M_current =
           (CommandLineFlagInfo *)
           std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::
           end((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> *)
               local_40);
      bVar1 = __gnu_cxx::operator!=(&local_58,&local_68);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
      ::operator->(&local_58);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar2 = strcmp(pcVar3,"flagfile");
      if (iVar2 == 0) {
        __gnu_cxx::
        __normal_iterator<google::CommandLineFlagInfo_const*,std::vector<google::CommandLineFlagInfo,std::allocator<google::CommandLineFlagInfo>>>
        ::__normal_iterator<google::CommandLineFlagInfo*>
                  ((__normal_iterator<google::CommandLineFlagInfo_const*,std::vector<google::CommandLineFlagInfo,std::allocator<google::CommandLineFlagInfo>>>
                    *)&local_70,&local_58);
        local_78 = (CommandLineFlagInfo *)
                   std::
                   vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                   ::erase((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                            *)local_40,local_70);
        break;
      }
      __gnu_cxx::
      __normal_iterator<google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
      ::operator++(&local_58);
    }
    __stream = flags.
               super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    TheseCommandlineFlagsIntoString_abi_cxx11_
              (local_98,(vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                         *)local_40);
    uVar4 = std::__cxx11::string::c_str();
    fprintf((FILE *)__stream,"%s",uVar4);
    std::__cxx11::string::~string((string *)local_98);
    fclose((FILE *)flags.
                   super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    filename_local._7_1_ = true;
    std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::~vector
              ((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> *)
               local_40);
  }
  else {
    filename_local._7_1_ = false;
  }
  return filename_local._7_1_;
}

Assistant:

bool AppendFlagsIntoFile(const string& filename, const char *prog_name) {
  FILE *fp;
  if (SafeFOpen(&fp, filename.c_str(), "a") != 0) {
    return false;
  }

  if (prog_name)
    fprintf(fp, "%s\n", prog_name);

  vector<CommandLineFlagInfo> flags;
  GetAllFlags(&flags);
  // But we don't want --flagfile, which leads to weird recursion issues
  vector<CommandLineFlagInfo>::iterator i;
  for (i = flags.begin(); i != flags.end(); ++i) {
    if (strcmp(i->name.c_str(), "flagfile") == 0) {
      flags.erase(i);
      break;
    }
  }
  fprintf(fp, "%s", TheseCommandlineFlagsIntoString(flags).c_str());

  fclose(fp);
  return true;
}